

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O2

void __thiscall
QPropertyAnimationPrivate::updateProperty(QPropertyAnimationPrivate *this,QVariant *newValue)

{
  QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
  *this_00;
  PrivateShared *pPVar1;
  QObject *this_01;
  parameter_type pVar2;
  int iVar3;
  parameter_type pQVar4;
  parameter_type pQVar5;
  char *name;
  long in_FS_OFFSET;
  int flags;
  int status;
  QVariant *local_48;
  QVariant *local_40;
  int *local_38;
  int *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
          ::value(&(this->super_QVariantAnimationPrivate).super_QAbstractAnimationPrivate.state);
  if (pVar2 != Stopped) {
    this_00 = &this->targetObject;
    pQVar4 = QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
             ::value(this_00);
    if (pQVar4 != (parameter_type)0x0) {
      iVar3 = ::QVariant::typeId(newValue);
      if (iVar3 != this->propertyType) {
        QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
        ::value(this_00);
        this_01 = (this->targetObject).super_QPropertyData<QObject_*>.val;
        pQVar5 = QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
                 ::value(&this->propertyName);
        name = (pQVar5->d).ptr;
        if (name == (char *)0x0) {
          name = &QByteArray::_empty;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QObject::setProperty(this_01,name,newValue);
          return;
        }
        goto LAB_00368909;
      }
      status = -1;
      flags = 0;
      local_48 = newValue;
      if (((newValue->d).field_0x18 & 1) != 0) {
        pPVar1 = (newValue->d).data.shared;
        local_48 = (QVariant *)
                   ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                           _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      local_38 = &status;
      local_30 = &flags;
      local_40 = newValue;
      pQVar4 = QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
               ::value(this_00);
      QMetaObject::metacall(pQVar4,WriteProperty,this->propertyIndex,&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00368909:
  __stack_chk_fail();
}

Assistant:

void QPropertyAnimationPrivate::updateProperty(const QVariant &newValue)
{
    if (state == QAbstractAnimation::Stopped)
        return;

    if (!targetObject)
        return;

    if (newValue.userType() == propertyType) {
        //no conversion is needed, we directly call the QMetaObject::metacall
        //check QMetaProperty::write for an explanation of these
        int status = -1;
        int flags = 0;
        void *argv[] = { const_cast<void *>(newValue.constData()), const_cast<QVariant *>(&newValue), &status, &flags };
        QMetaObject::metacall(targetObject, QMetaObject::WriteProperty, propertyIndex, argv);
    } else {
        targetObject->setProperty(propertyName.value().constData(), newValue);
    }
}